

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<cbtFace>::~cbtAlignedObjectArray(cbtAlignedObjectArray<cbtFace> *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->m_size;
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      cbtAlignedObjectArray<int>::~cbtAlignedObjectArray
                ((cbtAlignedObjectArray<int> *)((long)this->m_data->m_plane + lVar2 + -0x20));
      lVar2 = lVar2 + 0x30;
    } while ((long)iVar1 * 0x30 != lVar2);
  }
  if ((this->m_data != (cbtFace *)0x0) && (this->m_ownsMemory == true)) {
    cbtAlignedFreeInternal(this->m_data);
  }
  this->m_ownsMemory = true;
  this->m_data = (cbtFace *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  return;
}

Assistant:

~cbtAlignedObjectArray()
	{
		clear();
	}